

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::generateHeartbeat(Session *this,Message *testRequest)

{
  Header *header;
  FieldBase *field;
  FieldNotFound *anon_var_0;
  allocator<char> local_1e9;
  STRING local_1e8;
  MsgType local_1c8;
  undefined1 local_170 [8];
  Message heartbeat;
  Message *testRequest_local;
  Session *this_local;
  
  heartbeat._336_8_ = testRequest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"0",&local_1e9);
  MsgType::MsgType(&local_1c8,&local_1e8);
  newMessage((Message *)local_170,this,&local_1c8);
  MsgType::~MsgType(&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  header = Message::getHeader((Message *)local_170);
  fill(this,header);
  field = (FieldBase *)FieldMap::getField<FIX::TestReqID>((FieldMap *)heartbeat._336_8_);
  FieldMap::setField((FieldMap *)local_170,field,true);
  sendRaw(this,(Message *)local_170,0);
  Message::~Message((Message *)local_170);
  return;
}

Assistant:

void Session::generateHeartbeat(const Message &testRequest) {
  Message heartbeat = newMessage(MsgType(MsgType_Heartbeat));

  fill(heartbeat.getHeader());
  try {
    heartbeat.setField(testRequest.getField<TestReqID>());
  } catch (FieldNotFound &) {}

  sendRaw(heartbeat);
}